

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O2

string * ReplaceOrigin(string *__return_storage_ptr__,string *rpath,string *origin)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string end;
  string begin;
  RegularExpressionMatch match;
  
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originRegex == '\0')
     && (iVar2 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                      ::originRegex), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ReplaceOrigin::originRegex,"(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originRegex);
  }
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originCurlyRegex ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::originCurlyRegex), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression(&ReplaceOrigin::originCurlyRegex,"\\${ORIGIN}");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originCurlyRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originCurlyRegex);
  }
  match.startp[0] = (char *)0x0;
  match.endp[0] = (char *)0x0;
  match.searchstring = (char *)0x0;
  bVar1 = cmsys::RegularExpression::find
                    (&ReplaceOrigin::originRegex,(rpath->_M_dataplus)._M_p,&match);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&begin,(ulong)rpath);
    std::__cxx11::string::substr((ulong)&end,(ulong)rpath);
    std::operator+(&local_120,&begin,origin);
    std::operator+(__return_storage_ptr__,&local_120,&end);
  }
  else {
    bVar1 = cmsys::RegularExpression::find
                      (&ReplaceOrigin::originCurlyRegex,(rpath->_M_dataplus)._M_p,&match);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)rpath);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&begin,(ulong)rpath);
    std::__cxx11::string::substr((ulong)&end,(ulong)rpath);
    std::operator+(&local_120,&begin,origin);
    std::operator+(__return_storage_ptr__,&local_120,&end);
  }
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&end);
  std::__cxx11::string::~string((string *)&begin);
  return __return_storage_ptr__;
}

Assistant:

static std::string ReplaceOrigin(const std::string& rpath,
                                 const std::string& origin)
{
  static const cmsys::RegularExpression originRegex(
    "(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
  static const cmsys::RegularExpression originCurlyRegex("\\${ORIGIN}");

  cmsys::RegularExpressionMatch match;
  if (originRegex.find(rpath.c_str(), match)) {
    std::string begin = rpath.substr(0, match.start(1));
    std::string end = rpath.substr(match.end(1));
    return begin + origin + end;
  }
  if (originCurlyRegex.find(rpath.c_str(), match)) {
    std::string begin = rpath.substr(0, match.start());
    std::string end = rpath.substr(match.end());
    return begin + origin + end;
  }
  return rpath;
}